

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O2

void __thiscall QLineEditIconButton::paintEvent(QLineEditIconButton *this,QPaintEvent *param_1)

{
  int iVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  QLineEditPrivate *this_00;
  QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
  h;
  QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
  w;
  long in_FS_OFFSET;
  SideWidgetParameters SVar7;
  QRect QVar8;
  undefined1 local_78 [8];
  Representation local_70;
  Representation local_6c;
  QSize local_68;
  undefined1 *puStack_60;
  QWidgetData *local_58;
  int local_48;
  int local_44;
  QPainter painter;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  _painter = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter(&painter,&(this->super_QToolButton).super_QAbstractButton.super_QWidget.
                               super_QPaintDevice);
  if ((((this->super_QToolButton).super_QAbstractButton.super_QWidget.data)->widget_attributes & 1)
      == 0) {
    QAbstractButton::isDown((QAbstractButton *)this);
  }
  this_00 = lineEditPrivate(this);
  if (this_00 == (QLineEditPrivate *)0x0) {
    local_48 = 0x10;
  }
  else {
    SVar7 = QLineEditPrivate::sideWidgetParameters(this_00);
    local_48 = SVar7.iconSize;
  }
  local_58 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_44 = local_48;
  QAbstractButton::icon((QAbstractButton *)local_78);
  dVar4 = (double)QPaintDevice::devicePixelRatio();
  QIcon::pixmap(&local_68,dVar4,(Mode)local_78,(State)&local_48);
  QIcon::~QIcon((QIcon *)local_78);
  iVar6 = local_44;
  iVar5 = local_48;
  iVar1 = local_48 + -1;
  iVar2 = local_44 + -1;
  QVar8 = QWidget::rect((QWidget *)this);
  local_78._0_4_ = iVar1 / -2 + (int)(((long)QVar8.x2.m_i.m_i + (long)QVar8.x1.m_i.m_i) / 2);
  local_78._4_4_ = iVar2 / -2 + (int)(((QVar8._8_8_ >> 0x20) + (QVar8._0_8_ >> 0x20)) / 2);
  local_70.m_i = iVar5 + local_78._0_4_ + -1;
  local_6c.m_i = iVar6 + -1 + local_78._4_4_;
  QPainter::setOpacity(this->m_opacity);
  QPainter::drawPixmap(&painter,(QRect *)local_78,(QPixmap *)&local_68);
  QPixmap::~QPixmap((QPixmap *)&local_68);
  QPainter::~QPainter(&painter);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLineEditIconButton::paintEvent(QPaintEvent *)
{
    QPainter painter(this);
    QIcon::Mode state = QIcon::Disabled;
    if (isEnabled())
        state = isDown() ? QIcon::Active : QIcon::Normal;
    const QLineEditPrivate *lep = lineEditPrivate();
    const int iconWidth = lep ? lep->sideWidgetParameters().iconSize : 16;
    const QSize iconSize(iconWidth, iconWidth);
    const QPixmap iconPixmap = icon().pixmap(iconSize, devicePixelRatio(), state, QIcon::Off);
    QRect pixmapRect = QRect(QPoint(0, 0), iconSize);
    pixmapRect.moveCenter(rect().center());
    painter.setOpacity(m_opacity);
    painter.drawPixmap(pixmapRect, iconPixmap);
}